

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shell.cpp
# Opt level: O0

void anon_unknown.dwarf_5f2f::execute(string_view command)

{
  string_view x;
  string_view y;
  string_view y_00;
  string_view prefix;
  string_view prefix_00;
  string_view x_00;
  string_view x_01;
  bool bVar1;
  ostream *poVar2;
  char *in_RSI;
  ostream *in_RDI;
  double __x;
  double __x_00;
  string_view args;
  char *in_stack_ffffffffffffff28;
  string_view *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff40;
  string_view *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff58;
  char *pcVar3;
  string_view in_stack_ffffffffffffff60;
  string_view local_20;
  ostream *local_10;
  char *local_8;
  
  local_10 = in_RDI;
  local_8 = in_RSI;
  mserialize::string_view::string_view(&local_20);
  mserialize::string_view::string_view(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  prefix._len = in_stack_ffffffffffffff58;
  prefix._ptr = in_stack_ffffffffffffff50;
  bVar1 = prefixed(in_stack_ffffffffffffff60,prefix,in_stack_ffffffffffffff48);
  if (bVar1) {
    log(__x);
  }
  else {
    mserialize::string_view::string_view(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    prefix_00._len = in_stack_ffffffffffffff58;
    prefix_00._ptr = in_stack_ffffffffffffff50;
    bVar1 = prefixed(in_stack_ffffffffffffff60,prefix_00,in_stack_ffffffffffffff48);
    if (bVar1) {
      log(__x_00);
    }
    else {
      mserialize::string_view::string_view(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      x_00._len = in_stack_ffffffffffffff58;
      x_00._ptr = in_stack_ffffffffffffff50;
      y._len = (size_t)in_stack_ffffffffffffff48;
      y._ptr = in_stack_ffffffffffffff40;
      bVar1 = mserialize::operator==(x_00,y);
      if (bVar1) {
        terminate();
      }
      else {
        poVar2 = local_10;
        pcVar3 = local_8;
        mserialize::string_view::string_view(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        x_01._len = (size_t)pcVar3;
        x_01._ptr = (char *)poVar2;
        y_00._len = (size_t)in_stack_ffffffffffffff48;
        y_00._ptr = in_stack_ffffffffffffff40;
        bVar1 = mserialize::operator==(x_01,y_00);
        if (bVar1) {
          showHelp();
        }
        else {
          std::operator<<((ostream *)&std::cerr,"Unknown command ");
          x._len = (size_t)in_stack_ffffffffffffff40;
          x._ptr = local_8;
          poVar2 = mserialize::operator<<(local_10,x);
          std::operator<<(poVar2,"\n");
          showHelp();
        }
      }
    }
  }
  return;
}

Assistant:

void execute(mserialize::string_view command)
{
    mserialize::string_view args;

    if      (prefixed(command, "log w1 ", args)) { log(w1, args); }
    else if (prefixed(command, "log w2 ", args)) { log(w2, args); }
    else if (command == "terminate")             { terminate(); }
    else if (command == "help")                  { showHelp(); }
    else { std::cerr << "Unknown command " << command << "\n"; showHelp(); }
}